

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS
ref_recon_kexact_gradient_hessian
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *gradient,REF_DBL *hessian)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  REF_CLOUD pRVar4;
  uint uVar5;
  uint uVar6;
  REF_DBL *pRVar8;
  ulong uVar9;
  REF_DBL *pRVar10;
  long lVar11;
  double *pdVar12;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  REF_CLOUD *one_layer;
  REF_CLOUD *unaff_R13;
  REF_CELL pRVar18;
  uint uVar19;
  size_t sVar20;
  REF_NODE ref_node;
  ulong uVar21;
  REF_CLOUD ref_cloud;
  REF_DBL ab [90];
  uint local_434;
  double local_430;
  double local_428;
  double local_420;
  REF_INT local_414;
  double local_410;
  REF_NODE local_408;
  REF_CELL local_400;
  REF_DBL *local_3f8;
  undefined8 local_3f0;
  REF_DBL *local_3e8;
  REF_CLOUD *local_3e0;
  REF_DBL local_3d8;
  double dStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  REF_DBL *local_388;
  REF_DBL *local_380;
  REF_DBL *local_378;
  REF_GRID local_370;
  REF_CLOUD local_368;
  undefined8 *local_360;
  double *local_358;
  ulong local_350;
  double local_348;
  double dStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  REF_DBL local_308 [81];
  double local_80 [10];
  ulong uVar7;
  
  local_408 = ref_grid->node;
  if (ref_grid->twod == 0) {
    local_400 = ref_grid->cell[8];
  }
  else {
    local_400 = ref_grid->cell[3];
  }
  iVar2 = local_408->max;
  local_3e8 = hessian;
  local_378 = gradient;
  if ((long)iVar2 < 0) {
    bVar3 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3ca,
           "ref_recon_kexact_gradient_hessian","malloc one_layer of REF_CLOUD negative");
    local_434 = 1;
  }
  else {
    sVar20 = (long)iVar2 * 8;
    unaff_R13 = (REF_CLOUD *)malloc(sVar20);
    if (unaff_R13 == (REF_CLOUD *)0x0) {
      bVar3 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3ca
             ,"ref_recon_kexact_gradient_hessian","malloc one_layer of REF_CLOUD NULL");
      local_434 = 2;
      unaff_R13 = (REF_CLOUD *)0x0;
    }
    else {
      bVar3 = true;
      if (iVar2 != 0) {
        memset(unaff_R13,0,sVar20);
      }
    }
  }
  if (bVar3) {
    ref_node = local_408;
    local_3e0 = unaff_R13;
    local_370 = ref_grid;
    if (0 < local_408->max) {
      lVar17 = 0;
      do {
        if ((-1 < ref_node->global[lVar17]) &&
           (uVar5 = ref_cloud_create(unaff_R13,4), ref_node = local_408, uVar5 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x3cc,"ref_recon_kexact_gradient_hessian",(ulong)uVar5,"cloud storage");
          return uVar5;
        }
        lVar17 = lVar17 + 1;
        unaff_R13 = unaff_R13 + 1;
      } while (lVar17 < ref_node->max);
    }
    one_layer = local_3e0;
    local_434 = ref_recon_local_immediate_cloud(local_3e0,ref_node,local_400,scalar);
    if (local_434 == 0) {
      local_434 = ref_recon_ghost_cloud(one_layer,ref_node);
      if (local_434 == 0) {
        if (0 < ref_node->max) {
          local_350 = 0x7fffffff8;
          pRVar18 = (REF_CELL)0x0;
          do {
            if ((-1 < ref_node->global[(long)pRVar18]) &&
               (ref_node->ref_mpi->id == ref_node->part[(long)pRVar18])) {
              uVar5 = ref_cloud_deep_copy(&local_368,one_layer[(long)pRVar18]);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x3d6,"ref_recon_kexact_gradient_hessian",(ulong)uVar5,"create ref_cloud");
                return uVar5;
              }
              local_358 = (double *)(((long)pRVar18 * 0x30 & 0x7fffffff0U) + (long)local_3e8);
              local_360 = (undefined8 *)(((long)pRVar18 * 0x18 & local_350) + (long)local_378);
              uVar21 = 2;
              local_400 = pRVar18;
LAB_001b2ac8:
              pRVar18 = local_400;
              uVar5 = ref_recon_grow_cloud_one_layer(local_368,one_layer,ref_node);
              pRVar4 = local_368;
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x3da,"ref_recon_kexact_gradient_hessian",(ulong)uVar5,"grow");
                return uVar5;
              }
              lVar17 = -1;
              if (((long)pRVar18 < (long)ref_node->max) &&
                 (lVar17 = ref_node->global[(long)pRVar18], lVar17 < 0)) {
                lVar17 = -1;
              }
              iVar2 = local_370->twod;
              local_348 = 0.0;
              dStack_340 = 0.0;
              local_338 = 0;
              uStack_330 = 0;
              uVar5 = ref_cloud_item(local_368,lVar17,&local_414);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x1be,"ref_recon_kexact_with_aux",(ulong)uVar5,"missing center");
                local_3f0 = 0;
                goto LAB_001b2bb6;
              }
              lVar11 = (long)pRVar4->naux;
              if (0 < lVar11) {
                memcpy(&local_328,pRVar4->aux + local_414 * lVar11,lVar11 * 8);
              }
              uVar5 = pRVar4->n;
              uVar6 = (-(uint)(iVar2 == 0) | 3) + uVar5;
              uVar7 = (ulong)uVar6;
              local_3f0 = 0;
              if ((int)uVar6 < 9) {
                local_428 = 0.0;
                local_410 = 0.0;
                local_420 = 0.0;
                local_430 = 0.0;
                uVar5 = 4;
              }
              else {
                sVar20 = (ulong)(uVar6 * 9) << 3;
                pRVar8 = (REF_DBL *)malloc(sVar20);
                if (pRVar8 == (REF_DBL *)0x0) {
                  uVar13 = 0x1cb;
                  pcVar15 = "malloc a of REF_DBL NULL";
LAB_001b2ea7:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar13,"ref_recon_kexact_with_aux",pcVar15);
                  uVar5 = 2;
                }
                else {
                  local_3f8 = pRVar8;
                  pRVar8 = (REF_DBL *)malloc(sVar20);
                  if (pRVar8 == (REF_DBL *)0x0) {
                    uVar13 = 0x1cc;
                    pcVar15 = "malloc q of REF_DBL NULL";
                    goto LAB_001b2ea7;
                  }
                  local_380 = pRVar8;
                  pRVar8 = (REF_DBL *)malloc(0x288);
                  ref_node = local_408;
                  if (pRVar8 == (REF_DBL *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x1cd,"ref_recon_kexact_with_aux","malloc r of REF_DBL NULL");
                    uVar5 = 2;
LAB_001b2bb6:
                    local_428 = 0.0;
                    local_410 = 0.0;
                    local_420 = 0.0;
                    local_430 = 0.0;
                    goto LAB_001b2ed5;
                  }
                  if (iVar2 == 0) {
                    uVar19 = 0;
                  }
                  else {
                    local_3c8 = 0.0;
                    dStack_3c0 = 0.0;
                    local_3d8 = 0.0;
                    dStack_3d0 = 0.0;
                    local_3b8 = 0.0;
                    local_3b0 = 0.5;
                    local_3a8 = 0.0;
                    dStack_3a0 = 0.0;
                    local_398 = 1.0;
                    lVar16 = 0;
                    pRVar10 = local_3f8;
                    do {
                      *pRVar10 = (&local_3d8)[lVar16];
                      lVar16 = lVar16 + 1;
                      pRVar10 = pRVar10 + uVar7;
                    } while (lVar16 != 9);
                    local_3c8 = 0.0;
                    dStack_3c0 = 0.0;
                    local_3d8 = 0.0;
                    dStack_3d0 = 0.0;
                    local_3b8 = 0.0;
                    local_3b0 = 2.0;
                    local_3a8 = 0.0;
                    dStack_3a0 = 0.0;
                    local_398 = 2.0;
                    pRVar10 = local_3f8 + 1;
                    lVar16 = 0;
                    do {
                      *pRVar10 = (&local_3d8)[lVar16];
                      lVar16 = lVar16 + 1;
                      pRVar10 = pRVar10 + uVar7;
                    } while (lVar16 != 9);
                    local_3d8 = 0.5;
                    dStack_3d0 = 0.0;
                    local_3c8 = 1.0;
                    dStack_3c0 = 0.0;
                    local_3b8 = 0.0;
                    local_3b0 = 0.5;
                    local_3a8 = 1.0;
                    dStack_3a0 = 0.0;
                    local_398 = 1.0;
                    pRVar10 = local_3f8 + 2;
                    lVar16 = 0;
                    do {
                      *pRVar10 = (&local_3d8)[lVar16];
                      lVar16 = lVar16 + 1;
                      pRVar10 = pRVar10 + uVar7;
                    } while (lVar16 != 9);
                    local_3d8 = 0.0;
                    dStack_3d0 = 0.0;
                    local_3c8 = 0.0;
                    dStack_3c0 = 0.5;
                    local_3b8 = 1.0;
                    local_3b0 = 0.5;
                    local_3a8 = 0.0;
                    dStack_3a0 = 1.0;
                    local_398 = 1.0;
                    pRVar10 = local_3f8 + 3;
                    lVar16 = 0;
                    do {
                      *pRVar10 = (&local_3d8)[lVar16];
                      lVar16 = lVar16 + 1;
                      pRVar10 = pRVar10 + uVar7;
                    } while (lVar16 != 9);
                    uVar19 = 4;
                  }
                  local_414 = 0;
                  if (0 < (int)uVar5) {
                    lVar16 = *pRVar4->global;
                    uVar9 = 0;
                    do {
                      if (lVar16 != lVar17) {
                        pRVar10 = pRVar4->aux;
                        lVar16 = uVar9 * lVar11;
                        local_3a8 = pRVar10[lVar16] - local_328;
                        dStack_3a0 = pRVar10[lVar16 + 1] - local_320;
                        local_398 = pRVar10[lVar16 + 2] - local_318;
                        local_3d8 = local_3a8 * 0.5 * local_3a8;
                        dStack_3d0 = local_3a8 * dStack_3a0;
                        local_3c8 = local_3a8 * local_398;
                        dStack_3c0 = dStack_3a0 * 0.5 * dStack_3a0;
                        local_3b8 = dStack_3a0 * local_398;
                        local_3b0 = local_398 * 0.5 * local_398;
                        pRVar10 = local_3f8 + (int)uVar19;
                        lVar16 = 0;
                        do {
                          *pRVar10 = (&local_3d8)[lVar16];
                          lVar16 = lVar16 + 1;
                          pRVar10 = pRVar10 + uVar7;
                        } while (lVar16 != 9);
                        uVar19 = uVar19 + 1;
                      }
                      uVar9 = uVar9 + 1;
                      lVar16 = -1;
                      if (uVar9 < uVar5) {
                        lVar16 = pRVar4->global[uVar9];
                      }
                    } while (uVar9 != uVar5);
                    local_414 = (REF_INT)uVar9;
                  }
                  local_388 = pRVar8;
                  if (uVar6 == uVar19) {
                    uVar5 = ref_matrix_qr(uVar6,9,local_3f8,local_380,pRVar8);
                    if (uVar5 == 0) {
                      pRVar8 = local_308;
                      memset(pRVar8,0,0x2d0);
                      ref_node = local_408;
                      lVar11 = 0;
                      pRVar10 = local_388;
                      do {
                        lVar16 = 0;
                        do {
                          *(double *)((long)pRVar8 + lVar16) =
                               *(double *)((long)pRVar10 + lVar16) +
                               *(double *)((long)pRVar8 + lVar16);
                          lVar16 = lVar16 + 0x48;
                        } while (lVar16 != 0x288);
                        lVar11 = lVar11 + 1;
                        pRVar8 = pRVar8 + 1;
                        pRVar10 = pRVar10 + 1;
                      } while (lVar11 != 9);
                      if (iVar2 == 0) {
                        uVar5 = 0;
                      }
                      else {
                        lVar11 = 0;
                        pRVar8 = local_380;
                        do {
                          local_80[lVar11] = *pRVar8 * 0.0 + local_80[lVar11];
                          lVar11 = lVar11 + 1;
                          pRVar8 = pRVar8 + uVar7;
                        } while (lVar11 != 9);
                        pdVar12 = local_380 + 1;
                        lVar11 = 0;
                        do {
                          local_80[lVar11] = *pdVar12 * 0.0 + local_80[lVar11];
                          lVar11 = lVar11 + 1;
                          pdVar12 = pdVar12 + uVar7;
                        } while (lVar11 != 9);
                        pdVar12 = local_380 + 2;
                        lVar11 = 0;
                        do {
                          local_80[lVar11] = *pdVar12 * 0.0 + local_80[lVar11];
                          lVar11 = lVar11 + 1;
                          pdVar12 = pdVar12 + uVar7;
                        } while (lVar11 != 9);
                        pdVar12 = local_380 + 3;
                        lVar11 = 0;
                        do {
                          local_80[lVar11] = *pdVar12 * 0.0 + local_80[lVar11];
                          lVar11 = lVar11 + 1;
                          pdVar12 = pdVar12 + uVar7;
                        } while (lVar11 != 9);
                        uVar5 = 4;
                      }
                      local_414 = 0;
                      iVar2 = pRVar4->n;
                      uVar9 = (ulong)iVar2;
                      if ((long)uVar9 < 1) {
                        lVar11 = -1;
                      }
                      else {
                        lVar11 = *pRVar4->global;
                      }
                      if (0 < iVar2) {
                        uVar14 = 0;
                        do {
                          if (lVar11 != lVar17) {
                            dVar1 = pRVar4->aux[(long)(int)uVar14 * (long)pRVar4->naux + 3];
                            pdVar12 = local_380 + (int)uVar5;
                            lVar11 = 0;
                            do {
                              local_80[lVar11] = *pdVar12 * (dVar1 - local_310) + local_80[lVar11];
                              lVar11 = lVar11 + 1;
                              pdVar12 = pdVar12 + uVar7;
                            } while (lVar11 != 9);
                            uVar5 = uVar5 + 1;
                          }
                          uVar14 = uVar14 + 1;
                          lVar11 = -1;
                          if (uVar14 < uVar9) {
                            lVar11 = pRVar4->global[uVar14];
                          }
                          local_414 = iVar2;
                        } while (uVar14 != uVar9);
                      }
                      if (uVar6 == uVar5) {
                        uVar5 = ref_matrix_solve_ab(9,10,local_308);
                        local_428 = 0.0;
                        local_410 = 0.0;
                        local_420 = 0.0;
                        local_430 = 0.0;
                        if (uVar5 == 0) {
                          local_348 = local_80[0];
                          dStack_340 = local_80[1];
                          local_428 = local_80[2];
                          local_410 = local_80[3];
                          local_420 = local_80[4];
                          local_430 = local_80[5];
                          local_338 = local_80[6];
                          uStack_330 = local_80[7];
                          local_3f0 = local_80[8];
                          free(local_388);
                          free(local_380);
                          free(local_3f8);
                          uVar5 = 0;
                        }
                        goto LAB_001b2ed5;
                      }
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                             ,0x256,"ref_recon_kexact_with_aux","b row miscount",uVar7,
                             (long)(int)uVar5);
                      uVar5 = 1;
                      goto LAB_001b2bb6;
                    }
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x22f,"ref_recon_kexact_with_aux",(ulong)uVar5,"kexact lsq hess qr");
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,0x22e,"ref_recon_kexact_with_aux","A row miscount",uVar7,
                           (long)(int)uVar19);
                    uVar5 = 1;
                  }
                }
                local_428 = 0.0;
                local_410 = 0.0;
                local_420 = 0.0;
                local_430 = 0.0;
                ref_node = local_408;
              }
LAB_001b2ed5:
              pRVar18 = local_400;
              uVar6 = (uint)uVar21;
              if (uVar5 != 5) {
                if (4 < uVar6 && uVar5 == 4) {
                  ref_node_location(ref_node,(REF_INT)local_400);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_DIV_ZERO",uVar21)
                  ;
                }
                if (uVar5 == 8 && 4 < uVar6) {
                  ref_node_location(ref_node,(REF_INT)local_400);
                  printf(" caught %s, for %d layers to kexact cloud; retry\n","REF_ILL_CONDITIONED",
                         uVar21);
                }
                pRVar18 = local_400;
                if ((uVar5 == 0) || (uVar21 = (ulong)(uVar6 + 1), one_layer = local_3e0, 7 < uVar6))
                goto LAB_001b3500;
                goto LAB_001b2ac8;
              }
              ref_node_location(ref_node,(REF_INT)local_400);
              printf(" caught %s, for %d layers to kexact cloud; zero gradient and hessian\n",
                     "REF_NOT_FOUND",uVar21);
LAB_001b3500:
              if (local_378 != (REF_DBL *)0x0) {
                if (local_370->twod != 0) {
                  local_3f0 = 0;
                }
                *local_360 = local_338;
                local_360[1] = uStack_330;
                local_360[2] = local_3f0;
              }
              if (local_3e8 != (REF_DBL *)0x0) {
                if (local_370->twod != 0) {
                  local_428 = 0.0;
                  local_420 = 0.0;
                  local_430 = 0.0;
                }
                *local_358 = local_348;
                local_358[1] = dStack_340;
                local_358[2] = local_428;
                local_358[3] = local_410;
                local_358[4] = local_420;
                local_358[5] = local_430;
              }
              uVar5 = ref_cloud_free(local_368);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x404,"ref_recon_kexact_gradient_hessian",(ulong)uVar5,"free ref_cloud");
                return uVar5;
              }
            }
            pRVar18 = (REF_CELL)((long)&pRVar18->type + 1);
            one_layer = local_3e0;
          } while ((long)pRVar18 < (long)ref_node->max);
        }
        if (0 < ref_node->max) {
          lVar17 = 0;
          do {
            if (-1 < ref_node->global[lVar17]) {
              ref_cloud_free(one_layer[lVar17]);
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < ref_node->max);
        }
        if (one_layer != (REF_CLOUD *)0x0) {
          free(one_layer);
        }
        if ((local_378 == (REF_DBL *)0x0) ||
           (local_434 = ref_node_ghost_dbl(ref_node,local_378,3), local_434 == 0)) {
          if ((local_3e8 == (REF_DBL *)0x0) ||
             (local_434 = ref_node_ghost_dbl(ref_node,local_3e8,6), local_434 == 0)) {
            local_434 = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x412,"ref_recon_kexact_gradient_hessian",(ulong)local_434,"update ghosts");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x40e,"ref_recon_kexact_gradient_hessian",(ulong)local_434,"update ghosts");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x3d1,"ref_recon_kexact_gradient_hessian",(ulong)local_434,"fill ghosts");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3d0
             ,"ref_recon_kexact_gradient_hessian",(ulong)local_434,"fill immediate cloud");
    }
  }
  return local_434;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_kexact_gradient_hessian(REF_GRID ref_grid,
                                                            REF_DBL *scalar,
                                                            REF_DBL *gradient,
                                                            REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT node, im;
  REF_CLOUD ref_cloud;
  REF_DBL node_gradient[3], node_hessian[6];
  REF_STATUS status;
  REF_CLOUD *one_layer;
  REF_INT layer;

  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
  }

  RSS(ref_recon_local_immediate_cloud(one_layer, ref_node, ref_cell, scalar),
      "fill immediate cloud");
  RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      /* use ref_cloud to get a unique list of halo(2) nodes */
      RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]), "create ref_cloud");
      status = REF_INVALID;
      for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
        RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
            "grow");
        status = ref_recon_kexact_with_aux(ref_node_global(ref_node, node),
                                           ref_cloud, ref_grid_twod(ref_grid),
                                           node_gradient, node_hessian);
        if (REF_NOT_FOUND == status) {
          ref_node_location(ref_node, node);
          printf(
              " caught %s, for %d layers to kexact cloud; "
              "zero gradient and hessian\n",
              "REF_NOT_FOUND", layer);
          status = REF_SUCCESS;
          break;
        }
        if (REF_DIV_ZERO == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_DIV_ZERO", layer);
        }
        if (REF_ILL_CONDITIONED == status && layer > 4) {
          ref_node_location(ref_node, node);
          printf(" caught %s, for %d layers to kexact cloud; retry\n",
                 "REF_ILL_CONDITIONED", layer);
        }
      }
      if (NULL != gradient) {
        if (ref_grid_twod(ref_grid)) {
          node_gradient[2] = 0.0;
        }
        for (im = 0; im < 3; im++) {
          gradient[im + 3 * node] = node_gradient[im];
        }
      }
      if (NULL != hessian) {
        if (ref_grid_twod(ref_grid)) {
          node_hessian[2] = 0.0;
          node_hessian[4] = 0.0;
          node_hessian[5] = 0.0;
        }
        for (im = 0; im < 6; im++) {
          hessian[im + 6 * node] = node_hessian[im];
        }
      }
      RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    ref_cloud_free(one_layer[node]); /* no-op for null */
  }
  ref_free(one_layer);

  if (NULL != gradient) {
    RSS(ref_node_ghost_dbl(ref_node, gradient, 3), "update ghosts");
  }

  if (NULL != hessian) {
    RSS(ref_node_ghost_dbl(ref_node, hessian, 6), "update ghosts");
  }

  return REF_SUCCESS;
}